

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O0

HRESULT __thiscall Js::SimpleDataCacheWrapper::ReadHeader(SimpleDataCacheWrapper *this)

{
  DWORD local_2c;
  uint local_28;
  DWORD minorVersion;
  DWORD majorVersion;
  HRESULT hr;
  DWORD jscriptMinorVersion;
  DWORD jscriptMajorVersion;
  SimpleDataCacheWrapper *this_local;
  
  minorVersion = 0x80004005;
  _jscriptMinorVersion = this;
  minorVersion = AutoSystemInfo::GetJscriptFileVersion
                           ((DWORD *)&hr,&majorVersion,(DWORD *)0x0,(DWORD *)0x0);
  this_local._4_4_ = minorVersion;
  if ((-1 < (int)minorVersion) &&
     (minorVersion = Read<unsigned_int>(this,&local_28), this_local._4_4_ = minorVersion,
     -1 < (int)minorVersion)) {
    if (local_28 == hr) {
      this_local._4_4_ = Read<unsigned_int>(this,&local_2c);
      if ((-1 < (int)this_local._4_4_) && (local_2c != majorVersion)) {
        this_local._4_4_ = 0x80004005;
      }
    }
    else {
      this_local._4_4_ = 0x80004005;
    }
  }
  return this_local._4_4_;
}

Assistant:

HRESULT SimpleDataCacheWrapper::ReadHeader()
    {
        DWORD jscriptMajorVersion;
        DWORD jscriptMinorVersion;
        HRESULT hr = E_FAIL;

        IFFAILRET(AutoSystemInfo::GetJscriptFileVersion(&jscriptMajorVersion, &jscriptMinorVersion));

        DWORD majorVersion;
        IFFAILRET(Read(&majorVersion));
        if (majorVersion != jscriptMajorVersion)
        {
            return E_FAIL;
        }

        DWORD minorVersion;
        IFFAILRET(Read(&minorVersion));
        if (minorVersion != jscriptMinorVersion)
        {
            return E_FAIL;
        }

        return hr;
    }